

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O3

void test_val(float id,Am_Wrapper *result,Am_Wrapper *expected)

{
  Am_Wrapper *pAVar1;
  char cVar2;
  uint uVar3;
  long *plVar4;
  ostream *poVar5;
  
  test_counter = test_counter + 1;
  if (suppress_successful == 0) {
    poVar5 = std::ostream::_M_insert<double>((double)id);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"     ",5);
  }
  else {
    uVar3 = test_counter * -0x3d70a3d7 + 0x51eb850;
    if ((uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f) < 0x51eb851) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test ",5);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,test_counter);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
    }
  }
  cVar2 = (**(code **)(*(long *)result + 0x30))(result,expected);
  if (cVar2 == '\0') {
    poVar5 = std::ostream::_M_insert<double>((double)id);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"       expected ",0x10);
    poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," result is ",0xb);
    poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"*** TEST DID NOT SUCCEED. ***",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    failed_tests = failed_tests + 1;
  }
  else if (suppress_successful == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  result is ",0xc);
    poVar5 = std::ostream::_M_insert<void_const*>(&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  pAVar1 = result + 8;
  *(int *)pAVar1 = *(int *)pAVar1 + -1;
  if (*(int *)pAVar1 == 0) {
    (**(code **)(*(long *)result + 0x20))(result);
  }
  pAVar1 = expected + 8;
  *(int *)pAVar1 = *(int *)pAVar1 + -1;
  if (*(int *)pAVar1 != 0) {
    return;
  }
  (**(code **)(*(long *)expected + 0x20))(expected);
  return;
}

Assistant:

void
test_val(float id, Am_Wrapper *result, Am_Wrapper *expected)
{
  ++test_counter;
  if (suppress_successful) {
    if ((test_counter % 50) == 0)
      cout << "Test " << test_counter << endl;
  } else
    cout << id << "     ";

  if (*result == *expected) {
    if (!suppress_successful)
      cout << "  result is " << result << endl;
  } else {
    cout << id << "       expected " << expected << " result is " << result
         << endl
         << "*** TEST DID NOT SUCCEED. ***" << endl;
    ++failed_tests;
  }
  result->Release();
  expected->Release();
}